

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O1

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)1>(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkbyte10 Var28;
  undefined1 *puVar29;
  long lVar30;
  ulong uVar31;
  short sVar45;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  char cVar55;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  undefined1 in_XMM2 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  char cVar78;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  undefined1 auVar79 [16];
  short sVar89;
  short sVar96;
  short sVar97;
  short sVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar101;
  int iVar104;
  int iVar105;
  undefined1 auVar102 [16];
  int iVar106;
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar120;
  int iVar124;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  AssertionHandler catchAssertionHandler;
  ulong local_128;
  AlignedVector<int> local_110;
  int local_fc;
  AlignedVector<signed_char> local_f8;
  undefined8 local_e8;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  SourceLineInfo local_d8;
  ITransientExpression local_c8;
  undefined1 *local_b8;
  char *local_b0;
  size_t sStack_a8;
  int *local_a0;
  StringRef local_98;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  AssertionHandler local_78;
  undefined1 auVar34 [16];
  undefined1 auVar42 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar43 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined4 uVar90;
  undefined6 uVar91;
  undefined8 uVar92;
  undefined1 auVar93 [12];
  undefined1 auVar94 [14];
  undefined1 auVar95 [16];
  
  if (0 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_f8,0x10,0x40);
    AlignedVector<int>::AlignedVector(&local_110,0x10,0x40);
    auVar37 = _DAT_001b74d0;
    auVar38 = _DAT_001b74c0;
    auVar39 = _DAT_001b7490;
    auVar33 = _DAT_001b7480;
    auVar40 = _DAT_001b7470;
    auVar34 = _DAT_001b10c0;
    auVar84 = _DAT_001b10b0;
    if (local_f8.size_ != 0) {
      lVar30 = local_f8.size_ - 1;
      auVar32._8_4_ = (int)lVar30;
      auVar32._0_8_ = lVar30;
      auVar32._12_4_ = (int)((ulong)lVar30 >> 0x20);
      uVar31 = 0;
      do {
        auVar99._8_4_ = (int)uVar31;
        auVar99._0_8_ = uVar31;
        auVar99._12_4_ = (int)(uVar31 >> 0x20);
        auVar102 = auVar32 ^ auVar34;
        auVar107 = (auVar99 | auVar84) ^ auVar34;
        iVar101 = auVar102._0_4_;
        iVar120 = -(uint)(iVar101 < auVar107._0_4_);
        iVar104 = auVar102._4_4_;
        auVar109._4_4_ = -(uint)(iVar104 < auVar107._4_4_);
        iVar105 = auVar102._8_4_;
        iVar124 = -(uint)(iVar105 < auVar107._8_4_);
        iVar106 = auVar102._12_4_;
        auVar109._12_4_ = -(uint)(iVar106 < auVar107._12_4_);
        auVar46._4_4_ = iVar120;
        auVar46._0_4_ = iVar120;
        auVar46._8_4_ = iVar124;
        auVar46._12_4_ = iVar124;
        auVar46 = pshuflw(in_XMM1,auVar46,0xe8);
        auVar108._4_4_ = -(uint)(auVar107._4_4_ == iVar104);
        auVar108._12_4_ = -(uint)(auVar107._12_4_ == iVar106);
        auVar108._0_4_ = auVar108._4_4_;
        auVar108._8_4_ = auVar108._12_4_;
        auVar56 = pshuflw(in_XMM2,auVar108,0xe8);
        auVar109._0_4_ = auVar109._4_4_;
        auVar109._8_4_ = auVar109._12_4_;
        auVar107 = pshuflw(auVar46,auVar109,0xe8);
        auVar102._8_4_ = 0xffffffff;
        auVar102._0_8_ = 0xffffffffffffffff;
        auVar102._12_4_ = 0xffffffff;
        auVar102 = (auVar107 | auVar56 & auVar46) ^ auVar102;
        auVar102 = packssdw(auVar102,auVar102);
        cVar55 = (char)uVar31;
        if ((auVar102 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31] = cVar55 + -8;
        }
        auVar56._4_4_ = iVar120;
        auVar56._0_4_ = iVar120;
        auVar56._8_4_ = iVar124;
        auVar56._12_4_ = iVar124;
        auVar109 = auVar108 & auVar56 | auVar109;
        auVar102 = packssdw(auVar109,auVar109);
        auVar107._8_4_ = 0xffffffff;
        auVar107._0_8_ = 0xffffffffffffffff;
        auVar107._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 ^ auVar107,auVar102 ^ auVar107);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._0_4_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 1] = cVar55 + -7;
        }
        auVar102 = (auVar99 | auVar39) ^ auVar34;
        auVar57._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar57._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar57._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar57._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar110._4_4_ = auVar57._0_4_;
        auVar110._0_4_ = auVar57._0_4_;
        auVar110._8_4_ = auVar57._8_4_;
        auVar110._12_4_ = auVar57._8_4_;
        iVar120 = -(uint)(auVar102._4_4_ == iVar104);
        iVar124 = -(uint)(auVar102._12_4_ == iVar106);
        auVar14._4_4_ = iVar120;
        auVar14._0_4_ = iVar120;
        auVar14._8_4_ = iVar124;
        auVar14._12_4_ = iVar124;
        auVar121._4_4_ = auVar57._4_4_;
        auVar121._0_4_ = auVar57._4_4_;
        auVar121._8_4_ = auVar57._12_4_;
        auVar121._12_4_ = auVar57._12_4_;
        auVar102 = auVar14 & auVar110 | auVar121;
        auVar102 = packssdw(auVar102,auVar102);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 ^ auVar5,auVar102 ^ auVar5);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._0_4_ >> 0x10 & 1) != 0) {
          local_f8.mem_[uVar31 + 2] = cVar55 + -6;
        }
        auVar102 = pshufhw(auVar102,auVar110,0x84);
        auVar15._4_4_ = iVar120;
        auVar15._0_4_ = iVar120;
        auVar15._8_4_ = iVar124;
        auVar15._12_4_ = iVar124;
        auVar107 = pshufhw(auVar57,auVar15,0x84);
        auVar46 = pshufhw(auVar102,auVar121,0x84);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar46 | auVar107 & auVar102) ^ auVar47;
        auVar102 = packssdw(auVar47,auVar47);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._0_4_ >> 0x18 & 1) != 0) {
          local_f8.mem_[uVar31 + 3] = cVar55 + -5;
        }
        auVar102 = (auVar99 | auVar33) ^ auVar34;
        auVar58._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar58._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar58._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar58._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar16._4_4_ = auVar58._0_4_;
        auVar16._0_4_ = auVar58._0_4_;
        auVar16._8_4_ = auVar58._8_4_;
        auVar16._12_4_ = auVar58._8_4_;
        auVar107 = pshuflw(auVar121,auVar16,0xe8);
        auVar48._0_4_ = -(uint)(auVar102._0_4_ == iVar101);
        auVar48._4_4_ = -(uint)(auVar102._4_4_ == iVar104);
        auVar48._8_4_ = -(uint)(auVar102._8_4_ == iVar105);
        auVar48._12_4_ = -(uint)(auVar102._12_4_ == iVar106);
        auVar111._4_4_ = auVar48._4_4_;
        auVar111._0_4_ = auVar48._4_4_;
        auVar111._8_4_ = auVar48._12_4_;
        auVar111._12_4_ = auVar48._12_4_;
        auVar102 = pshuflw(auVar48,auVar111,0xe8);
        auVar112._4_4_ = auVar58._4_4_;
        auVar112._0_4_ = auVar58._4_4_;
        auVar112._8_4_ = auVar58._12_4_;
        auVar112._12_4_ = auVar58._12_4_;
        auVar46 = pshuflw(auVar58,auVar112,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 & auVar107,(auVar46 | auVar102 & auVar107) ^ auVar6);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 4] = cVar55 + -4;
        }
        auVar17._4_4_ = auVar58._0_4_;
        auVar17._0_4_ = auVar58._0_4_;
        auVar17._8_4_ = auVar58._8_4_;
        auVar17._12_4_ = auVar58._8_4_;
        auVar112 = auVar111 & auVar17 | auVar112;
        auVar46 = packssdw(auVar112,auVar112);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102,auVar46 ^ auVar7);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._4_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 5] = cVar55 + -3;
        }
        auVar102 = (auVar99 | auVar40) ^ auVar34;
        auVar59._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar59._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar59._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar59._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar113._4_4_ = auVar59._0_4_;
        auVar113._0_4_ = auVar59._0_4_;
        auVar113._8_4_ = auVar59._8_4_;
        auVar113._12_4_ = auVar59._8_4_;
        iVar120 = -(uint)(auVar102._4_4_ == iVar104);
        iVar124 = -(uint)(auVar102._12_4_ == iVar106);
        auVar18._4_4_ = iVar120;
        auVar18._0_4_ = iVar120;
        auVar18._8_4_ = iVar124;
        auVar18._12_4_ = iVar124;
        auVar122._4_4_ = auVar59._4_4_;
        auVar122._0_4_ = auVar59._4_4_;
        auVar122._8_4_ = auVar59._12_4_;
        auVar122._12_4_ = auVar59._12_4_;
        auVar102 = auVar18 & auVar113 | auVar122;
        auVar102 = packssdw(auVar102,auVar102);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 ^ auVar8,auVar102 ^ auVar8);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 6] = cVar55 + -2;
        }
        auVar102 = pshufhw(auVar102,auVar113,0x84);
        auVar19._4_4_ = iVar120;
        auVar19._0_4_ = iVar120;
        auVar19._8_4_ = iVar124;
        auVar19._12_4_ = iVar124;
        auVar107 = pshufhw(auVar59,auVar19,0x84);
        auVar46 = pshufhw(auVar102,auVar122,0x84);
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar49 = (auVar46 | auVar107 & auVar102) ^ auVar49;
        auVar102 = packssdw(auVar49,auVar49);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._6_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 7] = cVar55 + -1;
        }
        auVar102 = (auVar99 | auVar37) ^ auVar34;
        auVar60._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar60._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar60._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar60._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar20._4_4_ = auVar60._0_4_;
        auVar20._0_4_ = auVar60._0_4_;
        auVar20._8_4_ = auVar60._8_4_;
        auVar20._12_4_ = auVar60._8_4_;
        auVar107 = pshuflw(auVar122,auVar20,0xe8);
        auVar50._0_4_ = -(uint)(auVar102._0_4_ == iVar101);
        auVar50._4_4_ = -(uint)(auVar102._4_4_ == iVar104);
        auVar50._8_4_ = -(uint)(auVar102._8_4_ == iVar105);
        auVar50._12_4_ = -(uint)(auVar102._12_4_ == iVar106);
        auVar114._4_4_ = auVar50._4_4_;
        auVar114._0_4_ = auVar50._4_4_;
        auVar114._8_4_ = auVar50._12_4_;
        auVar114._12_4_ = auVar50._12_4_;
        auVar102 = pshuflw(auVar50,auVar114,0xe8);
        auVar115._4_4_ = auVar60._4_4_;
        auVar115._0_4_ = auVar60._4_4_;
        auVar115._8_4_ = auVar60._12_4_;
        auVar115._12_4_ = auVar60._12_4_;
        auVar46 = pshuflw(auVar60,auVar115,0xe8);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar46 | auVar102 & auVar107) ^ auVar61;
        auVar46 = packssdw(auVar61,auVar61);
        auVar102 = packsswb(auVar102 & auVar107,auVar46);
        if ((auVar102 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 8] = cVar55;
        }
        auVar21._4_4_ = auVar60._0_4_;
        auVar21._0_4_ = auVar60._0_4_;
        auVar21._8_4_ = auVar60._8_4_;
        auVar21._12_4_ = auVar60._8_4_;
        auVar115 = auVar114 & auVar21 | auVar115;
        auVar46 = packssdw(auVar115,auVar115);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar46 = packssdw(auVar46 ^ auVar9,auVar46 ^ auVar9);
        auVar102 = packsswb(auVar102,auVar46);
        if ((auVar102._8_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 9] = cVar55 + '\x01';
        }
        auVar102 = (auVar99 | auVar38) ^ auVar34;
        auVar62._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar62._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar62._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar62._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar116._4_4_ = auVar62._0_4_;
        auVar116._0_4_ = auVar62._0_4_;
        auVar116._8_4_ = auVar62._8_4_;
        auVar116._12_4_ = auVar62._8_4_;
        iVar120 = -(uint)(auVar102._4_4_ == iVar104);
        iVar124 = -(uint)(auVar102._12_4_ == iVar106);
        auVar22._4_4_ = iVar120;
        auVar22._0_4_ = iVar120;
        auVar22._8_4_ = iVar124;
        auVar22._12_4_ = iVar124;
        auVar123._4_4_ = auVar62._4_4_;
        auVar123._0_4_ = auVar62._4_4_;
        auVar123._8_4_ = auVar62._12_4_;
        auVar123._12_4_ = auVar62._12_4_;
        auVar102 = auVar22 & auVar116 | auVar123;
        auVar102 = packssdw(auVar102,auVar102);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 ^ auVar10,auVar102 ^ auVar10);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 10] = cVar55 + '\x02';
        }
        auVar102 = pshufhw(auVar102,auVar116,0x84);
        auVar23._4_4_ = iVar120;
        auVar23._0_4_ = iVar120;
        auVar23._8_4_ = iVar124;
        auVar23._12_4_ = iVar124;
        auVar107 = pshufhw(auVar62,auVar23,0x84);
        auVar46 = pshufhw(auVar102,auVar123,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar46 | auVar107 & auVar102) ^ auVar51;
        auVar102 = packssdw(auVar51,auVar51);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._10_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 0xb] = cVar55 + '\x03';
        }
        auVar102 = (auVar99 | _DAT_001b74b0) ^ auVar34;
        auVar63._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar63._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar63._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar63._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar24._4_4_ = auVar63._0_4_;
        auVar24._0_4_ = auVar63._0_4_;
        auVar24._8_4_ = auVar63._8_4_;
        auVar24._12_4_ = auVar63._8_4_;
        auVar107 = pshuflw(auVar123,auVar24,0xe8);
        auVar52._0_4_ = -(uint)(auVar102._0_4_ == iVar101);
        auVar52._4_4_ = -(uint)(auVar102._4_4_ == iVar104);
        auVar52._8_4_ = -(uint)(auVar102._8_4_ == iVar105);
        auVar52._12_4_ = -(uint)(auVar102._12_4_ == iVar106);
        auVar117._4_4_ = auVar52._4_4_;
        auVar117._0_4_ = auVar52._4_4_;
        auVar117._8_4_ = auVar52._12_4_;
        auVar117._12_4_ = auVar52._12_4_;
        auVar102 = pshuflw(auVar52,auVar117,0xe8);
        auVar118._4_4_ = auVar63._4_4_;
        auVar118._0_4_ = auVar63._4_4_;
        auVar118._8_4_ = auVar63._12_4_;
        auVar118._12_4_ = auVar63._12_4_;
        auVar46 = pshuflw(auVar63,auVar118,0xe8);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 & auVar107,(auVar46 | auVar102 & auVar107) ^ auVar11);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 0xc] = cVar55 + '\x04';
        }
        auVar25._4_4_ = auVar63._0_4_;
        auVar25._0_4_ = auVar63._0_4_;
        auVar25._8_4_ = auVar63._8_4_;
        auVar25._12_4_ = auVar63._8_4_;
        auVar118 = auVar117 & auVar25 | auVar118;
        auVar46 = packssdw(auVar118,auVar118);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102,auVar46 ^ auVar12);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102._12_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 0xd] = cVar55 + '\x05';
        }
        auVar102 = (auVar99 | _DAT_001b74a0) ^ auVar34;
        auVar53._0_4_ = -(uint)(iVar101 < auVar102._0_4_);
        auVar53._4_4_ = -(uint)(iVar104 < auVar102._4_4_);
        auVar53._8_4_ = -(uint)(iVar105 < auVar102._8_4_);
        auVar53._12_4_ = -(uint)(iVar106 < auVar102._12_4_);
        auVar119._4_4_ = auVar53._0_4_;
        auVar119._0_4_ = auVar53._0_4_;
        auVar119._8_4_ = auVar53._8_4_;
        auVar119._12_4_ = auVar53._8_4_;
        auVar100._4_4_ = -(uint)(auVar102._4_4_ == iVar104);
        auVar100._12_4_ = -(uint)(auVar102._12_4_ == iVar106);
        auVar100._0_4_ = auVar100._4_4_;
        auVar100._8_4_ = auVar100._12_4_;
        auVar103._4_4_ = auVar53._4_4_;
        auVar103._0_4_ = auVar53._4_4_;
        auVar103._8_4_ = auVar53._12_4_;
        auVar103._12_4_ = auVar53._12_4_;
        auVar46 = auVar100 & auVar119 | auVar103;
        auVar102 = packssdw(auVar53,auVar46);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar102 = packssdw(auVar102 ^ auVar13,auVar102 ^ auVar13);
        auVar102 = packsswb(auVar102,auVar102);
        if ((auVar102 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_f8.mem_[uVar31 + 0xe] = cVar55 + '\x06';
        }
        auVar102 = pshufhw(auVar102,auVar119,0x84);
        in_XMM2 = pshufhw(auVar46,auVar100,0x84);
        in_XMM2 = in_XMM2 & auVar102;
        auVar102 = pshufhw(auVar102,auVar103,0x84);
        auVar54._8_4_ = 0xffffffff;
        auVar54._0_8_ = 0xffffffffffffffff;
        auVar54._12_4_ = 0xffffffff;
        auVar54 = (auVar102 | in_XMM2) ^ auVar54;
        auVar102 = packssdw(auVar54,auVar54);
        in_XMM1 = packsswb(auVar102,auVar102);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          local_f8.mem_[uVar31 + 0xf] = cVar55 + '\a';
        }
        uVar31 = uVar31 + 0x10;
      } while ((local_f8.size_ + 0xf & 0xfffffffffffffff0) != uVar31);
    }
    auVar84 = *(undefined1 (*) [16])local_f8.mem_;
    if (kernels::upcast8to16(long_long(int))::vzero == '\0') {
      kernel_upcast8to32_test<(intgemm::CPUType)1>();
    }
    cVar55 = kernels::upcast8to16(long_long(int))::vzero[0];
    cVar64 = kernels::upcast8to16(long_long(int))::vzero[1];
    cVar65 = kernels::upcast8to16(long_long(int))::vzero[2];
    cVar66 = kernels::upcast8to16(long_long(int))::vzero[3];
    cVar67 = kernels::upcast8to16(long_long(int))::vzero[4];
    cVar68 = kernels::upcast8to16(long_long(int))::vzero[5];
    cVar69 = kernels::upcast8to16(long_long(int))::vzero[6];
    cVar70 = kernels::upcast8to16(long_long(int))::vzero[7];
    cVar71 = kernels::upcast8to16(long_long(int))::vzero[8];
    cVar72 = kernels::upcast8to16(long_long(int))::vzero[9];
    cVar73 = kernels::upcast8to16(long_long(int))::vzero[10];
    cVar74 = kernels::upcast8to16(long_long(int))::vzero[0xb];
    cVar75 = kernels::upcast8to16(long_long(int))::vzero[0xc];
    cVar76 = kernels::upcast8to16(long_long(int))::vzero[0xd];
    cVar77 = kernels::upcast8to16(long_long(int))::vzero[0xe];
    cVar78 = kernels::upcast8to16(long_long(int))::vzero[0xf];
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_e8._0_2_ =
           CONCAT11(kernels::upcast8to16(long_long(int))::vzero[1],
                    kernels::upcast8to16(long_long(int))::vzero[0]);
      local_e8._0_3_ = CONCAT12(kernels::upcast8to16(long_long(int))::vzero[2],(undefined2)local_e8)
      ;
      local_e8._0_4_ = CONCAT13(kernels::upcast8to16(long_long(int))::vzero[3],(undefined3)local_e8)
      ;
      local_e8._0_5_ = CONCAT14(kernels::upcast8to16(long_long(int))::vzero[4],(undefined4)local_e8)
      ;
      local_e8._0_6_ = CONCAT15(kernels::upcast8to16(long_long(int))::vzero[5],(undefined5)local_e8)
      ;
      local_e8._0_7_ = CONCAT16(kernels::upcast8to16(long_long(int))::vzero[6],(undefined6)local_e8)
      ;
      local_e8 = CONCAT17(kernels::upcast8to16(long_long(int))::vzero[7],(undefined7)local_e8);
      cStack_e0 = kernels::upcast8to16(long_long(int))::vzero[8];
      cStack_df = kernels::upcast8to16(long_long(int))::vzero[9];
      cStack_de = kernels::upcast8to16(long_long(int))::vzero[10];
      cStack_dd = kernels::upcast8to16(long_long(int))::vzero[0xb];
      cStack_dc = kernels::upcast8to16(long_long(int))::vzero[0xc];
      cStack_db = kernels::upcast8to16(long_long(int))::vzero[0xd];
      cStack_da = kernels::upcast8to16(long_long(int))::vzero[0xe];
      cStack_d9 = kernels::upcast8to16(long_long(int))::vzero[0xf];
      kernel_upcast8to32_test<(intgemm::CPUType)1>();
      cVar55 = (char)local_e8;
      cVar64 = local_e8._1_1_;
      cVar65 = local_e8._2_1_;
      cVar66 = local_e8._3_1_;
      cVar67 = local_e8._4_1_;
      cVar68 = local_e8._5_1_;
      cVar69 = local_e8._6_1_;
      cVar70 = local_e8._7_1_;
      cVar71 = cStack_e0;
      cVar72 = cStack_df;
      cVar73 = cStack_de;
      cVar74 = cStack_dd;
      cVar75 = cStack_dc;
      cVar76 = cStack_db;
      cVar77 = cStack_da;
      cVar78 = cStack_d9;
    }
    sVar89 = kernels::upcast16to32(long_long(int))::vzero._0_2_;
    sVar96 = kernels::upcast16to32(long_long(int))::vzero._2_2_;
    sVar97 = kernels::upcast16to32(long_long(int))::vzero._4_2_;
    sVar98 = kernels::upcast16to32(long_long(int))::vzero._6_2_;
    sVar85 = kernels::upcast16to32(long_long(int))::vzero._8_2_;
    sVar86 = kernels::upcast16to32(long_long(int))::vzero._10_2_;
    sVar87 = kernels::upcast16to32(long_long(int))::vzero._12_2_;
    sVar88 = kernels::upcast16to32(long_long(int))::vzero._14_2_;
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_e8._0_2_ = CONCAT11(cVar64,cVar55);
      local_e8._0_3_ = CONCAT12(cVar65,(undefined2)local_e8);
      local_e8._0_4_ = CONCAT13(cVar66,(undefined3)local_e8);
      local_e8._0_5_ = CONCAT14(cVar67,(undefined4)local_e8);
      local_e8._0_6_ = CONCAT15(cVar68,(undefined5)local_e8);
      local_e8._0_7_ = CONCAT16(cVar69,(undefined6)local_e8);
      local_e8 = CONCAT17(cVar70,(undefined7)local_e8);
      local_88 = kernels::upcast16to32(long_long(int))::vzero._0_2_;
      sStack_86 = kernels::upcast16to32(long_long(int))::vzero._2_2_;
      sStack_84 = kernels::upcast16to32(long_long(int))::vzero._4_2_;
      sStack_82 = kernels::upcast16to32(long_long(int))::vzero._6_2_;
      sStack_80 = kernels::upcast16to32(long_long(int))::vzero._8_2_;
      sStack_7e = kernels::upcast16to32(long_long(int))::vzero._10_2_;
      sStack_7c = kernels::upcast16to32(long_long(int))::vzero._12_2_;
      sStack_7a = kernels::upcast16to32(long_long(int))::vzero._14_2_;
      cStack_e0 = cVar71;
      cStack_df = cVar72;
      cStack_de = cVar73;
      cStack_dd = cVar74;
      cStack_dc = cVar75;
      cStack_db = cVar76;
      cStack_da = cVar77;
      cStack_d9 = cVar78;
      kernel_upcast8to32_test<(intgemm::CPUType)1>();
      cVar55 = (char)local_e8;
      cVar64 = local_e8._1_1_;
      cVar65 = local_e8._2_1_;
      cVar66 = local_e8._3_1_;
      cVar67 = local_e8._4_1_;
      cVar68 = local_e8._5_1_;
      cVar69 = local_e8._6_1_;
      cVar70 = local_e8._7_1_;
      cVar71 = cStack_e0;
      cVar72 = cStack_df;
      cVar73 = cStack_de;
      cVar74 = cStack_dd;
      cVar75 = cStack_dc;
      cVar76 = cStack_db;
      cVar77 = cStack_da;
      cVar78 = cStack_d9;
      sVar89 = local_88;
      sVar96 = sStack_86;
      sVar97 = sStack_84;
      sVar98 = sStack_82;
      sVar85 = sStack_80;
      sVar86 = sStack_7e;
      sVar87 = sStack_7c;
      sVar88 = sStack_7a;
    }
    auVar40._0_14_ = auVar84._0_14_;
    auVar40[0xe] = auVar84[7];
    auVar40[0xf] = -(auVar84[7] < cVar70);
    auVar39._14_2_ = auVar40._14_2_;
    auVar39._0_13_ = auVar84._0_13_;
    auVar39[0xd] = -(auVar84[6] < cVar69);
    auVar38._13_3_ = auVar39._13_3_;
    auVar38._0_12_ = auVar84._0_12_;
    auVar38[0xc] = auVar84[6];
    auVar37._12_4_ = auVar38._12_4_;
    auVar37._0_11_ = auVar84._0_11_;
    auVar37[0xb] = -(auVar84[5] < cVar68);
    auVar36._11_5_ = auVar37._11_5_;
    auVar36._0_10_ = auVar84._0_10_;
    auVar36[10] = auVar84[5];
    auVar35._10_6_ = auVar36._10_6_;
    auVar35._0_9_ = auVar84._0_9_;
    auVar35[9] = -(auVar84[4] < cVar67);
    auVar34._9_7_ = auVar35._9_7_;
    auVar34._0_8_ = auVar84._0_8_;
    auVar34[8] = auVar84[4];
    Var28 = CONCAT91(CONCAT81(auVar34._8_8_,-(auVar84[3] < cVar66)),auVar84[3]);
    auVar27._2_10_ = Var28;
    auVar27[1] = -(auVar84[2] < cVar65);
    auVar27[0] = auVar84[2];
    auVar26._2_12_ = auVar27;
    auVar26[1] = -(auVar84[1] < cVar64);
    auVar26[0] = auVar84[1];
    auVar33._0_2_ = CONCAT11(-(auVar84[0] < cVar55),auVar84[0]);
    auVar33._2_14_ = auVar26;
    sVar45 = (short)Var28;
    auVar44._0_12_ = auVar33._0_12_;
    auVar44._12_2_ = sVar45;
    auVar44._14_2_ = -(ushort)(sVar45 < sVar98);
    auVar43._12_4_ = auVar44._12_4_;
    auVar43._0_10_ = auVar33._0_10_;
    auVar43._10_2_ = -(ushort)(auVar27._0_2_ < sVar97);
    auVar42._10_6_ = auVar43._10_6_;
    auVar42._0_8_ = auVar33._0_8_;
    auVar42._8_2_ = auVar27._0_2_;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._6_2_ = -(ushort)(auVar26._0_2_ < sVar96);
    auVar41._4_2_ = auVar26._0_2_;
    auVar41._2_2_ = -(ushort)(auVar33._0_2_ < sVar89);
    auVar41._0_2_ = auVar33._0_2_;
    sVar89 = CONCAT11(-(auVar84[8] < cVar71),auVar84[8]);
    uVar90 = CONCAT13(-(auVar84[9] < cVar72),CONCAT12(auVar84[9],sVar89));
    uVar91 = CONCAT15(-(auVar84[10] < cVar73),CONCAT14(auVar84[10],uVar90));
    uVar92 = CONCAT17(-(auVar84[0xb] < cVar74),CONCAT16(auVar84[0xb],uVar91));
    auVar93._0_10_ = CONCAT19(-(auVar84[0xc] < cVar75),CONCAT18(auVar84[0xc],uVar92));
    auVar93[10] = auVar84[0xd];
    auVar93[0xb] = -(auVar84[0xd] < cVar76);
    auVar94[0xc] = auVar84[0xe];
    auVar94._0_12_ = auVar93;
    auVar94[0xd] = -(auVar84[0xe] < cVar77);
    auVar95[0xe] = auVar84[0xf];
    auVar95._0_14_ = auVar94;
    auVar95[0xf] = -(auVar84[0xf] < cVar78);
    sVar96 = (short)((uint)uVar90 >> 0x10);
    sVar97 = (short)((uint6)uVar91 >> 0x20);
    sVar98 = (short)((ulong)uVar92 >> 0x30);
    sVar45 = (short)((unkuint10)auVar93._0_10_ >> 0x40);
    bVar1 = sVar45 < (short)kernels::upcast16to32(long_long(int))::vzero._8_2_;
    bVar2 = auVar93._10_2_ < (short)kernels::upcast16to32(long_long(int))::vzero._10_2_;
    bVar3 = auVar94._12_2_ < (short)kernels::upcast16to32(long_long(int))::vzero._12_2_;
    bVar4 = auVar95._14_2_ < (short)kernels::upcast16to32(long_long(int))::vzero._14_2_;
    auVar84._12_2_ = sVar98;
    auVar84._0_12_ = auVar93;
    auVar84._14_2_ = -(ushort)(sVar98 < (short)kernels::upcast16to32(long_long(int))::vzero._6_2_);
    auVar83._12_4_ = auVar84._12_4_;
    auVar83._10_2_ = -(ushort)(sVar97 < (short)kernels::upcast16to32(long_long(int))::vzero._4_2_);
    auVar83._0_10_ = auVar93._0_10_;
    auVar82._10_6_ = auVar83._10_6_;
    auVar82._8_2_ = sVar97;
    auVar82._0_8_ = uVar92;
    auVar81._8_8_ = auVar82._8_8_;
    auVar81._6_2_ = -(ushort)(sVar96 < (short)kernels::upcast16to32(long_long(int))::vzero._2_2_);
    auVar81._0_6_ = uVar91;
    auVar80._6_10_ = auVar81._6_10_;
    auVar80._4_2_ = sVar96;
    auVar80._0_4_ = uVar90;
    auVar79._4_12_ = auVar80._4_12_;
    auVar79._2_2_ = -(ushort)(sVar89 < (short)kernels::upcast16to32(long_long(int))::vzero._0_2_);
    auVar79._0_2_ = sVar89;
    *(undefined1 (*) [16])local_110.mem_ = auVar41;
    *(short *)*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) = auVar34._8_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 2) =
         -(ushort)(auVar34._8_2_ < sVar85);
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 4) = auVar36._10_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 6) =
         -(ushort)(auVar36._10_2_ < sVar86);
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 8) = auVar38._12_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 10) =
         -(ushort)(auVar38._12_2_ < sVar87);
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 0xc) = auVar39._14_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x10) + 0xe) =
         -(ushort)(auVar39._14_2_ < sVar88);
    *(undefined1 (*) [16])((long)local_110.mem_ + 0x20) = auVar79;
    *(short *)*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) = sVar45;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 2) = -(ushort)bVar1;
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 4) = auVar93._10_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 6) = -(ushort)bVar2;
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 8) = auVar94._12_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 10) = -(ushort)bVar3;
    *(short *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 0xc) = auVar95._14_2_;
    *(ushort *)(*(undefined1 (*) [16])((long)local_110.mem_ + 0x30) + 0xe) = -(ushort)bVar4;
    if (local_110.size_ != 0) {
      lVar30 = 0;
      local_128 = 0;
      do {
        local_c8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_c8.m_isBinaryExpression = true;
        local_c8.m_result = false;
        local_c8._10_6_ = 0;
        local_d8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
        ;
        local_d8.line = 0x65;
        Catch::StringRef::StringRef(&local_98,"output[i] == int32_t(input[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_c8,&local_d8,local_98,ContinueOnFailure);
        cVar55 = local_f8.mem_[local_128];
        iVar101 = *(int *)((undefined1 *)local_110.mem_ + lVar30);
        puVar29 = (undefined1 *)local_110.mem_;
        local_fc = (int)cVar55;
        local_e8 = lVar30;
        Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
        local_c8.m_result = iVar101 == cVar55;
        local_c8.m_isBinaryExpression = true;
        local_c8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed958;
        local_b0 = local_d8.file;
        sStack_a8 = local_d8.line;
        local_a0 = &local_fc;
        local_b8 = puVar29 + lVar30;
        Catch::AssertionHandler::handleExpr(&local_78,&local_c8);
        Catch::ITransientExpression::~ITransientExpression(&local_c8);
        Catch::AssertionHandler::complete(&local_78);
        lVar30 = local_e8;
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        local_128 = local_128 + 1;
        lVar30 = lVar30 + 4;
      } while (local_128 < local_110.size_);
    }
    free(local_110.mem_);
    free(local_f8.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}